

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O1

bool __thiscall phyr::Sphere::intersectRay(Sphere *this,Ray *ray,bool testAlpha)

{
  FPError a;
  FPError b_00;
  FPError c;
  bool bVar1;
  double *pdVar2;
  FPError *pFVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  FPError t2;
  FPError t1;
  Ray lr;
  FPError b;
  Vector3f rdErr;
  Vector3f roErr;
  double local_258;
  double local_248;
  double local_228;
  FPError local_1f0;
  FPError local_1d8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  FPError local_180;
  FPError local_168;
  FPError local_150;
  double local_138;
  double dStack_130;
  double local_128;
  double local_120;
  double dStack_118;
  double local_110;
  FPError local_108;
  FPError local_f0;
  FPError local_d8;
  FPError local_c0;
  FPError local_a8;
  FPError local_90;
  Vector3f local_78;
  FPError local_60;
  Vector3f local_48;
  FPError local_30;
  
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 0.0;
  local_78.z = 0.0;
  local_78.x = 0.0;
  local_78.y = 0.0;
  Transform::operator()((this->super_Shape).worldToLocal,ray,&local_48,&local_78);
  local_90.v = local_1c0;
  if ((local_48.x != 0.0) || (NAN(local_48.x))) {
    local_90.lBound = local_1c0 - local_48.x;
    if (-INFINITY < local_90.lBound) {
      dVar4 = (double)(~-(ulong)(local_90.lBound == 0.0) & (ulong)local_90.lBound |
                      -(ulong)(local_90.lBound == 0.0) & 0x8000000000000000);
      local_90.lBound = (double)((long)dVar4 + (ulong)(dVar4 <= 0.0) * 2 + -1);
    }
    pdVar2 = &local_90.uBound;
    dVar4 = local_1c0 + local_48.x;
    if (dVar4 < INFINITY) {
      dVar4 = (double)(~-(ulong)(dVar4 == 0.0) & (ulong)dVar4);
      dVar4 = (double)((-(ulong)(dVar4 < 0.0) | 1) + (long)dVar4);
    }
  }
  else {
    pdVar2 = &local_90.lBound;
    local_90.uBound = local_1c0;
    dVar4 = local_1c0;
  }
  *pdVar2 = dVar4;
  local_a8.v = local_1b8;
  if ((local_48.y != 0.0) || (NAN(local_48.y))) {
    local_a8.lBound = local_1b8 - local_48.y;
    if (-INFINITY < local_a8.lBound) {
      dVar4 = (double)(~-(ulong)(local_a8.lBound == 0.0) & (ulong)local_a8.lBound |
                      -(ulong)(local_a8.lBound == 0.0) & 0x8000000000000000);
      local_a8.lBound = (double)((long)dVar4 + (ulong)(dVar4 <= 0.0) * 2 + -1);
    }
    pdVar2 = &local_a8.uBound;
    dVar4 = local_1b8 + local_48.y;
    if (dVar4 < INFINITY) {
      dVar4 = (double)(~-(ulong)(dVar4 == 0.0) & (ulong)dVar4);
      dVar4 = (double)((-(ulong)(dVar4 < 0.0) | 1) + (long)dVar4);
    }
  }
  else {
    pdVar2 = &local_a8.lBound;
    local_a8.uBound = local_1b8;
    dVar4 = local_1b8;
  }
  *pdVar2 = dVar4;
  local_c0.v = local_1b0;
  if ((local_48.z != 0.0) || (NAN(local_48.z))) {
    local_c0.lBound = local_1b0 - local_48.z;
    if (-INFINITY < local_c0.lBound) {
      dVar4 = (double)(~-(ulong)(local_c0.lBound == 0.0) & (ulong)local_c0.lBound |
                      -(ulong)(local_c0.lBound == 0.0) & 0x8000000000000000);
      local_c0.lBound = (double)((long)dVar4 + (ulong)(dVar4 <= 0.0) * 2 + -1);
    }
    pdVar2 = &local_c0.uBound;
    dVar4 = local_1b0 + local_48.z;
    if (dVar4 < INFINITY) {
      dVar4 = (double)(~-(ulong)(dVar4 == 0.0) & (ulong)dVar4);
      dVar4 = (double)((-(ulong)(dVar4 < 0.0) | 1) + (long)dVar4);
    }
  }
  else {
    pdVar2 = &local_c0.lBound;
    local_c0.uBound = local_1b0;
    dVar4 = local_1b0;
  }
  *pdVar2 = dVar4;
  local_d8.v = local_1a8;
  if ((local_78.x != 0.0) || (NAN(local_78.x))) {
    local_d8.lBound = local_1a8 - local_78.x;
    if (-INFINITY < local_d8.lBound) {
      dVar4 = (double)(~-(ulong)(local_d8.lBound == 0.0) & (ulong)local_d8.lBound |
                      -(ulong)(local_d8.lBound == 0.0) & 0x8000000000000000);
      local_d8.lBound = (double)((long)dVar4 + (ulong)(dVar4 <= 0.0) * 2 + -1);
    }
    pdVar2 = &local_d8.uBound;
    dVar4 = local_1a8 + local_78.x;
    if (dVar4 < INFINITY) {
      dVar4 = (double)(~-(ulong)(dVar4 == 0.0) & (ulong)dVar4);
      dVar4 = (double)((-(ulong)(dVar4 < 0.0) | 1) + (long)dVar4);
    }
  }
  else {
    pdVar2 = &local_d8.lBound;
    local_d8.uBound = local_1a8;
    dVar4 = local_1a8;
  }
  *pdVar2 = dVar4;
  local_f0.v = local_1a0;
  if ((local_78.y != 0.0) || (NAN(local_78.y))) {
    local_f0.lBound = local_1a0 - local_78.y;
    if (-INFINITY < local_f0.lBound) {
      dVar4 = (double)(~-(ulong)(local_f0.lBound == 0.0) & (ulong)local_f0.lBound |
                      -(ulong)(local_f0.lBound == 0.0) & 0x8000000000000000);
      local_f0.lBound = (double)((long)dVar4 + (ulong)(dVar4 <= 0.0) * 2 + -1);
    }
    pdVar2 = &local_f0.uBound;
    dVar4 = local_1a0 + local_78.y;
    if (dVar4 < INFINITY) {
      dVar4 = (double)(~-(ulong)(dVar4 == 0.0) & (ulong)dVar4);
      dVar4 = (double)((-(ulong)(dVar4 < 0.0) | 1) + (long)dVar4);
    }
  }
  else {
    pdVar2 = &local_f0.lBound;
    local_f0.uBound = local_1a0;
    dVar4 = local_1a0;
  }
  *pdVar2 = dVar4;
  local_108.v = local_198;
  if ((local_78.z != 0.0) || (NAN(local_78.z))) {
    local_108.lBound = local_198 - local_78.z;
    if (-INFINITY < local_108.lBound) {
      dVar4 = (double)(~-(ulong)(local_108.lBound == 0.0) & (ulong)local_108.lBound |
                      -(ulong)(local_108.lBound == 0.0) & 0x8000000000000000);
      local_108.lBound = (double)((long)dVar4 + (ulong)(dVar4 <= 0.0) * 2 + -1);
    }
    pdVar2 = &local_108.uBound;
    dVar4 = local_198 + local_78.z;
    if (dVar4 < INFINITY) {
      dVar4 = (double)(~-(ulong)(dVar4 == 0.0) & (ulong)dVar4);
      dVar4 = (double)((-(ulong)(dVar4 < 0.0) | 1) + (long)dVar4);
    }
  }
  else {
    pdVar2 = &local_108.lBound;
    local_108.uBound = local_198;
    dVar4 = local_198;
  }
  *pdVar2 = dVar4;
  FPError::operator*(&local_1d8,&local_d8,&local_d8);
  FPError::operator*(&local_150,&local_f0,&local_f0);
  dVar9 = local_150.v;
  dVar4 = local_1d8.v;
  local_1d8.lBound = local_1d8.lBound + local_150.lBound;
  if (-INFINITY < local_1d8.lBound) {
    dVar6 = (double)(~-(ulong)(local_1d8.lBound == 0.0) & (ulong)local_1d8.lBound |
                    -(ulong)(local_1d8.lBound == 0.0) & 0x8000000000000000);
    local_1d8.lBound = (double)((long)dVar6 + (ulong)(dVar6 <= 0.0) * 2 + -1);
  }
  local_258 = local_1d8.uBound + local_150.uBound;
  if (local_258 < INFINITY) {
    local_258 = (double)(~-(ulong)(local_258 == 0.0) & (ulong)local_258);
    local_258 = (double)((-(ulong)(local_258 < 0.0) | 1) + (long)local_258);
  }
  FPError::operator*(&local_1f0,&local_108,&local_108);
  dVar6 = local_1d8.lBound + local_1f0.lBound;
  if (-INFINITY < dVar6) {
    dVar6 = (double)(~-(ulong)(dVar6 == 0.0) & (ulong)dVar6 |
                    -(ulong)(dVar6 == 0.0) & 0x8000000000000000);
    dVar6 = (double)((long)dVar6 + (ulong)(dVar6 <= 0.0) * 2 + -1);
  }
  local_258 = local_258 + local_1f0.uBound;
  if (local_258 < INFINITY) {
    local_258 = (double)(~-(ulong)(local_258 == 0.0) & (ulong)local_258);
    local_258 = (double)((-(ulong)(local_258 < 0.0) | 1) + (long)local_258);
  }
  local_188 = local_1f0.v;
  FPError::operator*(&local_168,&local_90,&local_d8);
  FPError::operator*(&local_180,&local_a8,&local_f0);
  dVar5 = local_168.v;
  dVar7 = local_180.v;
  local_1f0.lBound = local_168.lBound + local_180.lBound;
  if (-INFINITY < local_1f0.lBound) {
    dVar8 = (double)(~-(ulong)(local_1f0.lBound == 0.0) & (ulong)local_1f0.lBound |
                    -(ulong)(local_1f0.lBound == 0.0) & 0x8000000000000000);
    local_1f0.lBound = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
  }
  local_228 = local_168.uBound + local_180.uBound;
  if (local_228 < INFINITY) {
    local_228 = (double)(~-(ulong)(local_228 == 0.0) & (ulong)local_228);
    local_228 = (double)((-(ulong)(local_228 < 0.0) | 1) + (long)local_228);
  }
  FPError::operator*(&local_60,&local_c0,&local_108);
  local_1f0.lBound = local_1f0.lBound + local_60.lBound;
  if (-INFINITY < local_1f0.lBound) {
    dVar8 = (double)(~-(ulong)(local_1f0.lBound == 0.0) & (ulong)local_1f0.lBound |
                    -(ulong)(local_1f0.lBound == 0.0) & 0x8000000000000000);
    local_1f0.lBound = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
  }
  local_1f0.uBound = local_228 + local_60.uBound;
  if (local_1f0.uBound < INFINITY) {
    local_1f0.uBound = (double)(~-(ulong)(local_1f0.uBound == 0.0) & (ulong)local_1f0.uBound);
    local_1f0.uBound = (double)((-(ulong)(local_1f0.uBound < 0.0) | 1) + (long)local_1f0.uBound);
  }
  local_1f0.v = dVar5 + dVar7 + local_60.v;
  local_1d8.uBound = 2.0;
  local_1d8.v = 2.0;
  local_1d8.lBound = 2.0;
  FPError::operator*(&local_150,&local_1d8,&local_1f0);
  FPError::operator*(&local_1d8,&local_90,&local_90);
  FPError::operator*(&local_1f0,&local_a8,&local_a8);
  dVar8 = local_1d8.v;
  dVar5 = local_1f0.v;
  dVar7 = local_1d8.lBound + local_1f0.lBound;
  if (-INFINITY < dVar7) {
    dVar7 = (double)(~-(ulong)(dVar7 == 0.0) & (ulong)dVar7 |
                    -(ulong)(dVar7 == 0.0) & 0x8000000000000000);
    dVar7 = (double)((long)dVar7 + (ulong)(dVar7 <= 0.0) * 2 + -1);
  }
  local_248 = local_1d8.uBound + local_1f0.uBound;
  if (local_248 < INFINITY) {
    local_248 = (double)(~-(ulong)(local_248 == 0.0) & (ulong)local_248);
    local_248 = (double)((-(ulong)(local_248 < 0.0) | 1) + (long)local_248);
  }
  FPError::operator*(&local_168,&local_c0,&local_c0);
  dVar7 = dVar7 + local_168.lBound;
  if (-INFINITY < dVar7) {
    dVar7 = (double)(~-(ulong)(dVar7 == 0.0) & (ulong)dVar7 |
                    -(ulong)(dVar7 == 0.0) & 0x8000000000000000);
    dVar7 = (double)((long)dVar7 + (ulong)(dVar7 <= 0.0) * 2 + -1);
  }
  local_248 = local_248 + local_168.uBound;
  if (local_248 < INFINITY) {
    local_248 = (double)(~-(ulong)(local_248 == 0.0) & (ulong)local_248);
    local_248 = (double)((-(ulong)(local_248 < 0.0) | 1) + (long)local_248);
  }
  local_60.v = this->radius;
  local_60.lBound = local_60.v;
  local_60.uBound = local_60.v;
  local_30.v = local_60.v;
  local_30.lBound = local_60.v;
  local_30.uBound = local_60.v;
  FPError::operator*(&local_180,&local_60,&local_30);
  dStack_130 = dVar7 - local_180.lBound;
  if (-INFINITY < dStack_130) {
    dVar7 = (double)(~-(ulong)(dStack_130 == 0.0) & (ulong)dStack_130 |
                    -(ulong)(dStack_130 == 0.0) & 0x8000000000000000);
    dStack_130 = (double)((long)dVar7 + (ulong)(dVar7 <= 0.0) * 2 + -1);
  }
  local_120 = dVar4 + dVar9 + local_188;
  local_128 = local_248 - local_180.uBound;
  if (local_128 < INFINITY) {
    local_128 = (double)(~-(ulong)(local_128 == 0.0) & (ulong)local_128);
    local_128 = (double)((-(ulong)(local_128 < 0.0) | 1) + (long)local_128);
  }
  local_138 = (dVar8 + dVar5 + local_168.v) - local_180.v;
  local_110 = local_258;
  a.lBound = dVar6;
  a.v = local_120;
  a.uBound = local_258;
  b_00.lBound = local_150.lBound;
  b_00.v = local_150.v;
  b_00.uBound = local_150.uBound;
  c.lBound = dStack_130;
  c.v = local_138;
  c.uBound = local_128;
  dStack_118 = dVar6;
  bVar1 = solveQuadraticSystem(a,b_00,c,&local_1d8,&local_1f0);
  if (bVar1) {
    if (local_190 < local_1d8.uBound) {
      return false;
    }
    if (local_1f0.lBound <= 0.0) {
      return false;
    }
    pFVar3 = &local_1d8;
    dVar4 = local_1d8.uBound;
    if ((0.0 < local_1d8.lBound) ||
       (pFVar3 = &local_1f0, dVar4 = local_1f0.uBound, local_1f0.uBound <= local_190)) {
      dVar9 = pFVar3->v;
      dVar5 = local_1a8 * dVar9 + local_1c0;
      dVar7 = local_1a0 * dVar9 + local_1b8;
      dVar8 = local_198 * dVar9 + local_1b0;
      dVar6 = this->radius;
      dVar7 = dVar8 * dVar8 + dVar5 * dVar5 + dVar7 * dVar7;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar8 = dVar8 * (dVar6 / dVar7);
      dVar6 = this->radius;
      if (((-dVar6 < this->zMin) && (dVar8 < this->zMin)) ||
         ((this->zMax < dVar6 && (this->zMax < dVar8)))) {
        if ((dVar9 == local_1f0.v) && (!NAN(dVar9) && !NAN(local_1f0.v))) {
          return false;
        }
        if (local_190 < dVar4) {
          return false;
        }
        local_1c0 = local_1a8 * local_1f0.v + local_1c0;
        local_1b8 = local_1a0 * local_1f0.v + local_1b8;
        dVar9 = local_1f0.v * local_198 + local_1b0;
        dVar4 = dVar9 * dVar9 + local_1c0 * local_1c0 + local_1b8 * local_1b8;
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        dVar9 = dVar9 * (dVar6 / dVar4);
        if ((-this->radius < this->zMin) && (dVar9 < this->zMin)) {
          return false;
        }
        if ((this->zMax < this->radius) && (this->zMax < dVar9)) {
          return false;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Sphere::intersectRay(const Ray& ray, bool testAlpha) const {
    Vector3f roErr, rdErr;
    // Transform ray to local space
    Ray lr = (*worldToLocal)(ray, &roErr, &rdErr);

    // Compute quadratic sphere coefficients
    FPError ox(lr.o.x, roErr.x), oy(lr.o.y, roErr.y), oz(lr.o.z, roErr.z);
    FPError dx(lr.d.x, rdErr.x), dy(lr.d.y, rdErr.y), dz(lr.d.z, rdErr.z);
    FPError a = dx * dx + dy * dy + dz * dz;
    FPError b = 2 * (ox * dx + oy * dy + oz * dz);
    FPError c = ox * ox + oy * oy + oz * oz - FPError(radius) * FPError(radius);

    // Solve quadratic equation for t
    FPError t1, t2;
    // No intersections
    if (!solveQuadraticSystem(a, b, c, &t1, &t2)) return false;

    // Check for trivial range exclusion
    if (t1.upperBound() > lr.tMax || t2.lowerBound() <= 0) return false;
    FPError t0 = t1;
    if (t0.lowerBound() <= 0) {
        t0 = t2; if (t0.upperBound() > lr.tMax) return false;
    }

    Point3f hpt = lr(Real(t0));
    // Reproject the point onto the surface to refine it
    hpt *= radius / distance(hpt, Point3f(0, 0, 0));

    if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax)) {
        // If ray origin is inside the sphere and t2 intersects a clipped region
        if (t0 == t2) return false;
        // We're looking at a hole in the sphere on the near side.
        // Test intersection with the farther side
        if (t0.upperBound() > lr.tMax) return false;

        // Test with t1 failed, try t2
        t0 = t2; hpt = lr(Real(t0));
        // Reproject the point onto the surface to refine it
        hpt *= radius / distance(hpt, Point3f(0, 0, 0));

        if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax))
            return false;
    }

    return true;
}